

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

int tcu::measurePixelDiffAccuracy
              (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,Surface *result
              ,int bestScoreDiff,int worstScoreDiff,CompareLogMode logMode)

{
  int iVar1;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  Surface::getAccess(&local_80,reference);
  Surface::getAccess(&local_58,result);
  iVar1 = measurePixelDiffAccuracy
                    (log,imageSetName,imageSetDesc,&local_80,&local_58,bestScoreDiff,worstScoreDiff,
                     logMode);
  return iVar1;
}

Assistant:

int measurePixelDiffAccuracy (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, int bestScoreDiff, int worstScoreDiff, CompareLogMode logMode)
{
	return measurePixelDiffAccuracy(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), bestScoreDiff, worstScoreDiff, logMode);
}